

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidatePushElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *qname)

{
  xmlValidState *pxVar1;
  xmlElementPtr pxVar2;
  xmlElementPtr elemDecl;
  xmlValidStatePtr state;
  xmlElementPtr pxStack_40;
  int extsubset;
  xmlElementPtr eDecl;
  xmlChar *pxStack_30;
  int ret;
  xmlChar *qname_local;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  eDecl._4_4_ = 1;
  state._4_4_ = 0;
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else {
    pxStack_30 = qname;
    qname_local = (xmlChar *)elem;
    elem_local = (xmlNodePtr)doc;
    doc_local = (xmlDocPtr)ctxt;
    if (((0 < ctxt->vstateNr) && (ctxt->vstate != (xmlValidState *)0x0)) &&
       (pxVar1 = ctxt->vstate, pxVar1->elemDecl != (xmlElementPtr)0x0)) {
      pxVar2 = pxVar1->elemDecl;
      switch(pxVar2->etype) {
      case XML_ELEMENT_TYPE_UNDEFINED:
        eDecl._4_4_ = 0;
        break;
      case XML_ELEMENT_TYPE_EMPTY:
        eDecl._4_4_ = 0;
        break;
      case XML_ELEMENT_TYPE_ANY:
        break;
      case XML_ELEMENT_TYPE_MIXED:
        if ((pxVar2->content == (xmlElementContentPtr)0x0) ||
           (pxVar2->content->type != XML_ELEMENT_CONTENT_PCDATA)) {
          eDecl._4_4_ = xmlValidateCheckMixed(ctxt,pxVar2->content,qname);
        }
        else {
          eDecl._4_4_ = 0;
        }
        break;
      case XML_ELEMENT_TYPE_ELEMENT:
        if (pxVar1->exec != (xmlRegExecCtxtPtr)0x0) {
          eDecl._4_4_ = xmlRegExecPushString(pxVar1->exec,qname,(void *)0x0);
          if (eDecl._4_4_ == -5) {
            xmlVErrMemory((xmlValidCtxtPtr)doc_local);
            return 0;
          }
          eDecl._4_4_ = (uint)(-1 < (int)eDecl._4_4_);
        }
      }
    }
    pxStack_40 = xmlValidGetElemDecl((xmlValidCtxtPtr)doc_local,(xmlDocPtr)elem_local,
                                     (xmlNodePtr)qname_local,(int *)((long)&state + 4));
    vstateVPush((xmlValidCtxtPtr)doc_local,pxStack_40,(xmlNodePtr)qname_local);
    ctxt_local._4_4_ = eDecl._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidatePushElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       xmlNodePtr elem, const xmlChar *qname) {
    int ret = 1;
    xmlElementPtr eDecl;
    int extsubset = 0;

    if (ctxt == NULL)
        return(0);

    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    switch(elemDecl->etype) {
		case XML_ELEMENT_TYPE_UNDEFINED:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_EMPTY:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_ANY:
		    /* I don't think anything is required then */
		    break;
		case XML_ELEMENT_TYPE_MIXED:
		    /* simple case of declared as #PCDATA */
		    if ((elemDecl->content != NULL) &&
			(elemDecl->content->type ==
			 XML_ELEMENT_CONTENT_PCDATA)) {
			ret = 0;
		    } else {
			ret = xmlValidateCheckMixed(ctxt, elemDecl->content,
				                    qname);
		    }
		    break;
		case XML_ELEMENT_TYPE_ELEMENT:
		    /*
		     * TODO:
		     * VC: Standalone Document Declaration
		     *     - element types with element content, if white space
		     *       occurs directly within any instance of those types.
		     */
		    if (state->exec != NULL) {
			ret = xmlRegExecPushString(state->exec, qname, NULL);
                        if (ret == XML_REGEXP_OUT_OF_MEMORY) {
                            xmlVErrMemory(ctxt);
                            return(0);
                        }
			if (ret < 0) {
			    ret = 0;
			} else {
			    ret = 1;
			}
		    }
		    break;
	    }
	}
    }
    eDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    vstateVPush(ctxt, eDecl, elem);
    return(ret);
}